

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_decoder.h
# Opt level: O2

bool __thiscall
draco::
MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::DecodePredictionData
          (MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,DecoderBuffer *buffer)

{
  bool bVar1;
  undefined8 in_RAX;
  uint8_t prediction_mode;
  byte local_11;
  
  local_11 = (byte)((ulong)in_RAX >> 0x38);
  bVar1 = PredictionSchemeWrapDecodingTransform<int,_int>::DecodeTransformData
                    (&(this->
                      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                      ).
                      super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                      .transform_,buffer);
  if (bVar1) {
    if (buffer->bitstream_version_ < 0x202) {
      bVar1 = DecoderBuffer::Decode<unsigned_char>(buffer,&local_11);
      if ((!bVar1) || (TRIANGLE_AREA < local_11)) goto LAB_00157357;
      (this->predictor_).
      super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
      .normal_prediction_mode_ = (uint)local_11;
    }
    bVar1 = RAnsBitDecoder::StartDecoding(&this->flip_normal_bit_decoder_,buffer);
  }
  else {
LAB_00157357:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MeshPredictionSchemeGeometricNormalDecoder<
    DataTypeT, TransformT, MeshDataT>::DecodePredictionData(DecoderBuffer
                                                                *buffer) {
  // Get data needed for transform
  if (!this->transform().DecodeTransformData(buffer)) {
    return false;
  }

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    uint8_t prediction_mode;
    if (!buffer->Decode(&prediction_mode)) {
      return false;
    }

    if (!predictor_.SetNormalPredictionMode(
            NormalPredictionMode(prediction_mode))) {
      return false;
    }
  }
#endif

  // Init normal flips.
  if (!flip_normal_bit_decoder_.StartDecoding(buffer)) {
    return false;
  }

  return true;
}